

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::make_init_node_1
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  value_type *pvVar6;
  uint local_14;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *local_10;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this_local;
  
  local_10 = this;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
           ::operator[](&this->items,0);
  pvVar4 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
           ::operator[](&this->items,0);
  local_14 = 0;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node>>
  ::emplace_back<double&,int&,unsigned_int>
            ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node>>
              *)&this->nodes,&pvVar3->r,&pvVar4->factor,&local_14);
  sVar2 = shared_subvector::emplace(&this->subvector);
  pvVar5 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ::back(&this->nodes);
  pvVar5->variables = sVar2;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
           ::operator[](&this->items,0);
  dVar1 = pvVar3->sum_z;
  pvVar5 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ::back(&this->nodes);
  pvVar5->z = dVar1;
  pvVar5 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ::back(&this->nodes);
  shared_subvector::fill(&this->subvector,pvVar5->variables,'\0');
  pvVar5 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ::back(&this->nodes);
  pvVar6 = shared_subvector::operator[](&this->subvector,pvVar5->variables);
  *pvVar6 = '\x01';
  return;
}

Assistant:

void make_init_node_1()
    {
        nodes.emplace_back(items[0].r, items[0].factor, 0u);
        nodes.back().variables = subvector.emplace();
        nodes.back().z = items[0].sum_z;

        subvector.fill(nodes.back().variables, 0);
        subvector[nodes.back().variables] = 1;
    }